

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O0

void front::word::word_analyse
               (string *input_str,
               vector<front::word::Word,_std::allocator<front::word::Word>_> *word_arr)

{
  _Alloc_hider *p_Var1;
  value_type *pvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  value_type *pvVar6;
  undefined1 *puVar7;
  long lVar8;
  Word *in_RSI;
  string *in_RDI;
  int stt;
  char ch;
  size_t index;
  string buf;
  value_type *in_stack_fffffffffffff668;
  Word *in_stack_fffffffffffff670;
  Word *in_stack_fffffffffffff678;
  Word *in_stack_fffffffffffff680;
  Word *in_stack_fffffffffffff688;
  Word *in_stack_fffffffffffff690;
  Word *in_stack_fffffffffffff698;
  Word *in_stack_fffffffffffff6a0;
  undefined8 in_stack_fffffffffffff6a8;
  char __lhs;
  string local_898 [80];
  string local_848 [80];
  string local_7f8 [80];
  string local_7a8 [80];
  string local_758 [80];
  string local_708 [80];
  string local_6b8 [80];
  string local_668 [80];
  string local_618 [80];
  string local_5c8 [80];
  string local_578 [80];
  string local_528 [80];
  string local_4d8 [80];
  string local_488 [80];
  string local_438 [80];
  string local_3e8 [80];
  string local_398 [80];
  string local_348 [80];
  string local_2f8 [80];
  string local_2a8 [84];
  uint local_254;
  string local_250 [80];
  string local_200 [80];
  string local_1b0 [80];
  string local_160 [80];
  string local_110 [80];
  string local_c0 [96];
  string local_60 [39];
  char local_39;
  value_type *local_38;
  string local_30 [32];
  Word *local_10;
  string *local_8;
  
  __lhs = (char)((ulong)in_stack_fffffffffffff6a8 >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  local_38 = (value_type *)0x0;
  local_39 = '\0';
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff6a0);
  std::__cxx11::string::operator=(local_8,local_60);
  std::__cxx11::string::~string(local_60);
LAB_002b96c3:
  pvVar2 = local_38;
  pvVar6 = (value_type *)std::__cxx11::string::size();
  if (pvVar2 < pvVar6) {
    get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
             (string *)in_stack_fffffffffffff670);
    std::__cxx11::string::clear();
    do {
      bVar3 = have_body_char(local_39);
      if (bVar3) {
        bVar4 = is_illegel_char(local_39);
        bVar3 = false;
        if (bVar4) goto LAB_002b9770;
      }
      else {
LAB_002b9770:
        p_Var1 = (_Alloc_hider *)&local_38->token_value;
        puVar7 = (undefined1 *)std::__cxx11::string::size();
        bVar3 = p_Var1 + 1 < puVar7;
      }
      if (!bVar3) goto LAB_002b97f3;
      get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
               (string *)in_stack_fffffffffffff670);
    } while( true );
  }
  goto LAB_002bb655;
LAB_002b97f3:
  bVar3 = is_nodigit('\0');
  if (bVar3) {
    do {
      std::__cxx11::string::operator+=(local_30,local_39);
      get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
               (string *)in_stack_fffffffffffff670);
      bVar4 = is_nodigit('\0');
      bVar3 = true;
      if (!bVar4) {
        iVar5 = isdigit((int)local_39);
        bVar3 = iVar5 != 0;
      }
    } while (bVar3);
    retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,(string *)0x2b98c6
           );
    get_token((string *)in_stack_fffffffffffff668);
    std::__cxx11::string::string(local_c0,local_30);
    Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
               (string *)in_stack_fffffffffffff690,(uint)((ulong)in_stack_fffffffffffff688 >> 0x20))
    ;
    std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
              ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
               in_stack_fffffffffffff670,in_stack_fffffffffffff668);
    Word::~Word((Word *)0x2b994d);
    std::__cxx11::string::~string(local_c0);
  }
  else {
    iVar5 = isdigit((int)local_39);
    if (iVar5 == 0) {
      if (local_39 == '\"') {
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        while (local_39 != '\"') {
          std::__cxx11::string::operator+=(local_30,local_39);
          get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                   (string *)in_stack_fffffffffffff670);
        }
        std::__cxx11::string::string(local_160,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2b9dbf);
        std::__cxx11::string::~string(local_160);
      }
      else if (local_39 == '+') {
        std::__cxx11::string::operator+=(local_30,'+');
        std::__cxx11::string::string(local_1b0,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2b9eaf);
        std::__cxx11::string::~string(local_1b0);
      }
      else if (local_39 == '-') {
        std::__cxx11::string::operator+=(local_30,'-');
        std::__cxx11::string::string(local_200,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2b9f9f);
        std::__cxx11::string::~string(local_200);
      }
      else if (local_39 == '*') {
        std::__cxx11::string::operator+=(local_30,'*');
        std::__cxx11::string::string(local_250,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2ba08f);
        std::__cxx11::string::~string(local_250);
      }
      else if (local_39 == '/') {
        std::__cxx11::string::operator+=(local_30,'/');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        if (local_39 == '/') {
          do {
            get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                     (string *)in_stack_fffffffffffff670);
          } while (local_39 != '\n');
        }
        else if (local_39 == '*') {
          local_254 = 0;
          do {
            get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                     (string *)in_stack_fffffffffffff670);
            if ((local_254 == 0) && (local_39 == '*')) {
              local_254 = 1;
            }
            if (local_254 == 1) {
              if (local_39 == '/') {
                local_254 = 2;
              }
              else {
                local_254 = (uint)(local_39 == '*');
              }
            }
          } while ((int)local_254 < 2);
        }
        else {
          retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                  (string *)0x2ba251);
          std::__cxx11::string::string(local_2a8,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2ba2c0);
          std::__cxx11::string::~string(local_2a8);
        }
      }
      else if (local_39 == '%') {
        std::__cxx11::string::operator+=(local_30,'%');
        std::__cxx11::string::string(local_2f8,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2ba3b4);
        std::__cxx11::string::~string(local_2f8);
      }
      else if (local_39 == '<') {
        std::__cxx11::string::operator+=(local_30,'<');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        if (local_39 == '=') {
          std::__cxx11::string::operator+=(local_30,'=');
          std::__cxx11::string::string(local_348,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2ba4eb);
          std::__cxx11::string::~string(local_348);
        }
        else {
          retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                  (string *)0x2ba563);
          std::__cxx11::string::string(local_398,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2ba5d2);
          std::__cxx11::string::~string(local_398);
        }
      }
      else if (local_39 == '>') {
        std::__cxx11::string::operator+=(local_30,'>');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        if (local_39 == '=') {
          std::__cxx11::string::operator+=(local_30,'=');
          std::__cxx11::string::string(local_3e8,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2ba70b);
          std::__cxx11::string::~string(local_3e8);
        }
        else {
          retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                  (string *)0x2ba783);
          std::__cxx11::string::string(local_438,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2ba7ec);
          std::__cxx11::string::~string(local_438);
        }
      }
      else if (local_39 == '=') {
        std::__cxx11::string::operator+=(local_30,'=');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        if (local_39 == '=') {
          std::__cxx11::string::operator+=(local_30,'=');
          std::__cxx11::string::string(local_488,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2ba91f);
          std::__cxx11::string::~string(local_488);
        }
        else {
          retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                  (string *)0x2ba997);
          std::__cxx11::string::string(local_4d8,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2baa00);
          std::__cxx11::string::~string(local_4d8);
        }
      }
      else if (local_39 == '!') {
        std::__cxx11::string::operator+=(local_30,'!');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        if (local_39 == '=') {
          std::__cxx11::string::operator+=(local_30,'=');
          std::__cxx11::string::string(local_528,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2bab33);
          std::__cxx11::string::~string(local_528);
        }
        else {
          retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                  (string *)0x2babab);
          std::__cxx11::string::string(local_578,local_30);
          Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                     (string *)in_stack_fffffffffffff690,
                     (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
          std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                    ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                     in_stack_fffffffffffff670,in_stack_fffffffffffff668);
          Word::~Word((Word *)0x2bac14);
          std::__cxx11::string::~string(local_578);
        }
      }
      else if (local_39 == '&') {
        std::__cxx11::string::operator+=(local_30,'&');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        std::__cxx11::string::operator+=(local_30,local_39);
        std::__cxx11::string::string(local_5c8,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bad36);
        std::__cxx11::string::~string(local_5c8);
      }
      else if (local_39 == '|') {
        std::__cxx11::string::operator+=(local_30,'|');
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        std::__cxx11::string::operator+=(local_30,local_39);
        std::__cxx11::string::string(local_618,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bae56);
        std::__cxx11::string::~string(local_618);
      }
      else if (local_39 == ';') {
        std::__cxx11::string::operator+=(local_30,';');
        std::__cxx11::string::string(local_668,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2baf40);
        std::__cxx11::string::~string(local_668);
      }
      else if (local_39 == ',') {
        std::__cxx11::string::operator+=(local_30,',');
        in_stack_fffffffffffff6a0 = local_10;
        std::__cxx11::string::string(local_6b8,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb02a);
        std::__cxx11::string::~string(local_6b8);
      }
      else if (local_39 == '(') {
        std::__cxx11::string::operator+=(local_30,'(');
        in_stack_fffffffffffff698 = local_10;
        std::__cxx11::string::string(local_708,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb114);
        std::__cxx11::string::~string(local_708);
      }
      else if (local_39 == ')') {
        std::__cxx11::string::operator+=(local_30,')');
        in_stack_fffffffffffff690 = local_10;
        std::__cxx11::string::string(local_758,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb1fe);
        std::__cxx11::string::~string(local_758);
      }
      else if (local_39 == '[') {
        std::__cxx11::string::operator+=(local_30,'[');
        in_stack_fffffffffffff688 = local_10;
        std::__cxx11::string::string(local_7a8,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb2e8);
        std::__cxx11::string::~string(local_7a8);
      }
      else if (local_39 == ']') {
        std::__cxx11::string::operator+=(local_30,']');
        in_stack_fffffffffffff680 = local_10;
        std::__cxx11::string::string(local_7f8,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb3d2);
        std::__cxx11::string::~string(local_7f8);
      }
      else if (local_39 == '{') {
        std::__cxx11::string::operator+=(local_30,'{');
        in_stack_fffffffffffff678 = local_10;
        std::__cxx11::string::string(local_848,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb4bc);
        std::__cxx11::string::~string(local_848);
      }
      else if (local_39 == '}') {
        std::__cxx11::string::operator+=(local_30,'}');
        in_stack_fffffffffffff670 = local_10;
        std::__cxx11::string::string(local_898,local_30);
        Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                   (string *)in_stack_fffffffffffff690,
                   (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
        std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                  ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                   in_stack_fffffffffffff670,in_stack_fffffffffffff668);
        Word::~Word((Word *)0x2bb5a6);
        std::__cxx11::string::~string(local_898);
      }
    }
    else {
      if (local_39 == '0') {
        iVar5 = toupper(0x30);
        std::__cxx11::string::operator+=(local_30,(char)iVar5);
        get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                 (string *)in_stack_fffffffffffff670);
        if ((local_39 == 'x') || (local_39 == 'X')) {
          iVar5 = toupper((int)local_39);
          std::__cxx11::string::operator+=(local_30,(char)iVar5);
          get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                   (string *)in_stack_fffffffffffff670);
          do {
            iVar5 = toupper((int)local_39);
            std::__cxx11::string::operator+=(local_30,(char)iVar5);
            get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                     (string *)in_stack_fffffffffffff670);
            bVar3 = hex_digit('\0');
          } while (bVar3);
          retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                  (string *)0x2b9b57);
        }
        else {
          bVar3 = octal_digit(local_39);
          if (bVar3) {
            do {
              std::__cxx11::string::operator+=(local_30,local_39);
              get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                       (string *)in_stack_fffffffffffff670);
              iVar5 = isdigit((int)local_39);
            } while (iVar5 != 0);
            retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                    (string *)0x2b9bea);
          }
          else {
            retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                    (string *)0x2b9c0b);
          }
        }
      }
      else {
        do {
          std::__cxx11::string::operator+=(local_30,local_39);
          get_char((char *)in_stack_fffffffffffff680,(size_t *)in_stack_fffffffffffff678,
                   (string *)in_stack_fffffffffffff670);
          iVar5 = isdigit((int)local_39);
        } while (iVar5 != 0);
        retract((char *)in_stack_fffffffffffff670,(size_t *)in_stack_fffffffffffff668,
                (string *)0x2b9a34);
      }
      std::__cxx11::string::string(local_110,local_30);
      Word::Word(in_stack_fffffffffffff6a0,(Token)((ulong)in_stack_fffffffffffff698 >> 0x20),
                 (string *)in_stack_fffffffffffff690,
                 (uint)((ulong)in_stack_fffffffffffff688 >> 0x20));
      std::vector<front::word::Word,_std::allocator<front::word::Word>_>::push_back
                ((vector<front::word::Word,_std::allocator<front::word::Word>_> *)
                 in_stack_fffffffffffff670,in_stack_fffffffffffff668);
      Word::~Word((Word *)0x2b9c80);
      std::__cxx11::string::~string(local_110);
    }
  }
  in_stack_fffffffffffff668 = local_38;
  lVar8 = std::__cxx11::string::size();
  if (in_stack_fffffffffffff668 == (value_type *)(lVar8 + -1)) {
LAB_002bb655:
    std::__cxx11::string::~string(local_30);
    return;
  }
  goto LAB_002b96c3;
}

Assistant:

void front::word::word_analyse(string &input_str, vector<Word> &word_arr) {
  string buf;
  size_t index = 0;
  char ch = 0;
  input_str = '\0' + input_str;
  while (index < input_str.size()) {
    get_char(ch, index, input_str);
    buf.clear();
    while ((!have_body_char(ch) || is_illegel_char(ch)) &&
           index + 1 < input_str.size()) {
      get_char(ch, index, input_str);
    }

    if (is_nodigit(ch)) {
      do {
        buf += ch;
        get_char(ch, index, input_str);
      } while (is_nodigit(ch) || isdigit(ch));
      retract(ch, index, input_str);
      word_arr.push_back(Word(get_token(buf), buf, line_num));
    } else if (isdigit(ch)) {
      if (ch != '0') {
        do {
          buf += ch;
          get_char(ch, index, input_str);
        } while (isdigit(ch));
        retract(ch, index, input_str);
      } else {
        buf += toupper(ch);
        get_char(ch, index, input_str);
        if (ch == 'x' || ch == 'X') {
          buf += toupper(ch);
          get_char(ch, index, input_str);
          do {
            buf += toupper(ch);
            get_char(ch, index, input_str);
          } while (hex_digit(ch));
          retract(ch, index, input_str);
        } else if (octal_digit(ch)) {
          do {
            buf += ch;
            get_char(ch, index, input_str);
          } while (isdigit(ch));
          retract(ch, index, input_str);

        } else {
          retract(ch, index, input_str);
        }
      }
      word_arr.push_back(Word(Token::INTCON, buf, line_num));
    } else if (ch == '\"') {
      get_char(ch, index, input_str);
      while (ch != '\"') {
        buf += ch;
        get_char(ch, index, input_str);
      }
      word_arr.push_back(Word(Token::STRCON, buf, line_num));
    } else if (ch == '+') {
      buf += ch;
      word_arr.push_back(Word(Token::PLUS, buf, line_num));
    } else if (ch == '-') {
      buf += ch;
      word_arr.push_back(Word(Token::MINU, buf, line_num));
    } else if (ch == '*') {
      buf += ch;
      word_arr.push_back(Word(Token::MULT, buf, line_num));
    } else if (ch == '/') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '/') {
        do {
          get_char(ch, index, input_str);
        } while (ch != '\n');
      } else if (ch == '*') {
        int stt = 0;
        do {
          get_char(ch, index, input_str);
          if (stt == 0) {
            if (ch == '*') {
              stt = 1;
            }
          }
          if (stt == 1) {
            if (ch == '/') {
              stt = 2;
            } else if (ch == '*') {
              stt = 1;
            } else {
              stt = 0;
            }
          }
        } while (stt < 2);
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::DIV, buf, line_num));
      }
    } else if (ch == '%') {
      buf += ch;
      word_arr.push_back(Word(Token::MOD, buf, line_num));
    } else if (ch == '<') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::LEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::LSS, buf, line_num));
      }
    } else if (ch == '>') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::GEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::GRE, buf, line_num));
      }
    } else if (ch == '=') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::EQL, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::ASSIGN, buf, line_num));
      }
    } else if (ch == '!') {
      buf += ch;
      get_char(ch, index, input_str);
      if (ch == '=') {
        buf += ch;
        word_arr.push_back(Word(Token::NEQ, buf, line_num));
      } else {
        retract(ch, index, input_str);
        word_arr.push_back(Word(Token::NOT, buf, line_num));
      }

    } else if (ch == '&') {
      buf += ch;
      get_char(ch, index, input_str);
      buf += ch;
      word_arr.push_back(Word(Token::AND, buf, line_num));
    } else if (ch == '|') {
      buf += ch;
      get_char(ch, index, input_str);
      buf += ch;
      word_arr.push_back(Word(Token::OR, buf, line_num));
    } else if (ch == ';') {
      buf += ch;
      word_arr.push_back(Word(Token::SEMICN, buf, line_num));
    } else if (ch == ',') {
      buf += ch;
      word_arr.push_back(Word(Token::COMMA, buf, line_num));
    } else if (ch == '(') {
      buf += ch;
      word_arr.push_back(Word(Token::LPARENT, buf, line_num));
    } else if (ch == ')') {
      buf += ch;
      word_arr.push_back(Word(Token::RPARENT, buf, line_num));
    } else if (ch == '[') {
      buf += ch;
      word_arr.push_back(Word(Token::LBRACK, buf, line_num));
    } else if (ch == ']') {
      buf += ch;
      word_arr.push_back(Word(Token::RBRACK, buf, line_num));
    } else if (ch == '{') {
      buf += ch;
      word_arr.push_back(Word(Token::LBRACE, buf, line_num));
    } else if (ch == '}') {
      buf += ch;
      word_arr.push_back(Word(Token::RBRACE, buf, line_num));
    }

    if (index == input_str.size() - 1) {
      break;
    }
  }
}